

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc,stbrp_rect *rects,int num_rects)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar7;
  
  if (num_rects < 1) {
    uVar7 = 0;
  }
  else {
    piVar4 = (int *)spc->pack_info;
    iVar1 = *piVar4;
    iVar2 = piVar4[1];
    iVar9 = piVar4[2];
    iVar10 = piVar4[3];
    piVar8 = &rects->was_packed;
    uVar6 = 0;
    do {
      iVar3 = piVar8[-2];
      if (iVar1 < iVar3 + iVar9) {
        piVar4[2] = 0;
        iVar10 = piVar4[4];
        piVar4[3] = iVar10;
        iVar9 = 0;
      }
      iVar11 = piVar8[-1] + iVar10;
      uVar7 = uVar6;
      if (iVar2 < iVar11) break;
      ((stbrp_rect *)(piVar8 + -5))->x = iVar9;
      piVar8[-4] = iVar10;
      *piVar8 = 1;
      iVar9 = iVar3 + iVar9;
      piVar4[2] = iVar9;
      if (piVar4[4] < iVar11) {
        piVar4[4] = iVar11;
      }
      uVar6 = uVar6 + 1;
      piVar8 = piVar8 + 6;
      uVar7 = (ulong)(uint)num_rects;
    } while ((uint)num_rects != uVar6);
  }
  if ((int)uVar7 < num_rects) {
    piVar8 = &rects[uVar7 & 0xffffffff].was_packed;
    do {
      *piVar8 = 0;
      uVar5 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar5;
      piVar8 = piVar8 + 6;
    } while ((int)uVar5 < num_rects);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc, stbrp_rect *rects, int num_rects)
{
   stbrp_pack_rects((stbrp_context *) spc->pack_info, rects, num_rects);
}